

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c
# Opt level: O0

void debug_print_pk(mbedtls_ssl_context *ssl,int level,char *file,int line,char *text,
                   mbedtls_pk_context *pk)

{
  int iVar1;
  char local_98 [8];
  char name [16];
  mbedtls_pk_debug_item items [3];
  size_t i;
  mbedtls_pk_context *pk_local;
  char *text_local;
  int line_local;
  char *file_local;
  int level_local;
  mbedtls_ssl_context *ssl_local;
  
  memset(name + 8,0,0x48);
  iVar1 = mbedtls_pk_debug(pk,(mbedtls_pk_debug_item *)(name + 8));
  if (iVar1 == 0) {
    items[2].value = (void *)0x0;
    while ((items[2].value < (void *)0x3 && (*(int *)&items[(long)items[2].value + -1].value != 0)))
    {
      snprintf(local_98,0x10,"%s%s",text,*(undefined8 *)(items + (long)items[2].value));
      name[7] = '\0';
      if (*(int *)&items[(long)items[2].value + -1].value == 1) {
        mbedtls_debug_print_mpi
                  (ssl,level,file,line,local_98,(mbedtls_mpi *)items[(long)items[2].value].name);
      }
      else if (*(int *)&items[(long)items[2].value + -1].value == 2) {
        mbedtls_debug_print_ecp
                  (ssl,level,file,line,local_98,
                   (mbedtls_ecp_point *)items[(long)items[2].value].name);
      }
      else {
        debug_send_line(ssl,level,file,line,"should not happen\n");
      }
      items[2].value = (void *)((long)items[2].value + 1);
    }
  }
  else {
    debug_send_line(ssl,level,file,line,"invalid PK context\n");
  }
  return;
}

Assistant:

static void debug_print_pk( const mbedtls_ssl_context *ssl, int level,
                            const char *file, int line,
                            const char *text, const mbedtls_pk_context *pk )
{
    size_t i;
    mbedtls_pk_debug_item items[MBEDTLS_PK_DEBUG_MAX_ITEMS];
    char name[16];

    memset( items, 0, sizeof( items ) );

    if( mbedtls_pk_debug( pk, items ) != 0 )
    {
        debug_send_line( ssl, level, file, line,
                          "invalid PK context\n" );
        return;
    }

    for( i = 0; i < MBEDTLS_PK_DEBUG_MAX_ITEMS; i++ )
    {
        if( items[i].type == MBEDTLS_PK_DEBUG_NONE )
            return;

        mbedtls_snprintf( name, sizeof( name ), "%s%s", text, items[i].name );
        name[sizeof( name ) - 1] = '\0';

        if( items[i].type == MBEDTLS_PK_DEBUG_MPI )
            mbedtls_debug_print_mpi( ssl, level, file, line, name, items[i].value );
        else
#if defined(MBEDTLS_ECP_C)
        if( items[i].type == MBEDTLS_PK_DEBUG_ECP )
            mbedtls_debug_print_ecp( ssl, level, file, line, name, items[i].value );
        else
#endif
            debug_send_line( ssl, level, file, line,
                              "should not happen\n" );
    }
}